

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O1

void CodeAperiodicity(double **aperiodicity,int f0_length,int fs,int fft_size,
                     double **coded_aperiodicity)

{
  uint xi_length;
  double *xi;
  double *y;
  ulong uVar1;
  ulong uVar2;
  uint x_length;
  double dVar3;
  double dVar4;
  
  dVar3 = (double)fs * 0.5 + -3000.0;
  dVar4 = 15000.0;
  if (dVar3 <= 15000.0) {
    dVar4 = dVar3;
  }
  xi_length = (uint)(dVar4 / 3000.0);
  uVar2 = (long)(int)xi_length * 8;
  if ((int)xi_length < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar2);
  if (0 < (int)xi_length) {
    uVar2 = 0;
    do {
      uVar1 = uVar2 + 1;
      xi[uVar2] = (double)(uVar1 & 0xffffffff) * 3000.0;
      uVar2 = uVar1;
    } while (xi_length != uVar1);
  }
  uVar2 = (long)(fft_size / 2) * 8 + 8;
  if (fft_size < -3) {
    uVar2 = 0xffffffffffffffff;
  }
  y = (double *)operator_new__(uVar2);
  if (0 < f0_length) {
    x_length = fft_size / 2 + 1;
    uVar2 = 0;
    do {
      if (-2 < fft_size) {
        uVar1 = 0;
        do {
          dVar4 = log10(aperiodicity[uVar2][uVar1]);
          y[uVar1] = dVar4 * 20.0;
          uVar1 = uVar1 + 1;
        } while (x_length != uVar1);
      }
      interp1Q(0.0,(double)fs / (double)fft_size,y,x_length,xi,xi_length,coded_aperiodicity[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)f0_length);
  }
  operator_delete__(xi);
  operator_delete__(y);
  return;
}

Assistant:

void CodeAperiodicity(const double * const *aperiodicity, int f0_length,
    int fs, int fft_size, double **coded_aperiodicity) {
  int number_of_aperiodicities = GetNumberOfAperiodicities(fs);
  double *coarse_frequency_axis = new double[number_of_aperiodicities];
  for (int i = 0; i < number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = world::kFrequencyInterval * (i + 1.0);

  double *log_aperiodicity = new double[fft_size / 2 + 1];

  for (int i = 0; i < f0_length; ++i) {
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      log_aperiodicity[j] = 20 * log10(aperiodicity[i][j]);
    interp1Q(0, static_cast<double>(fs) / fft_size, log_aperiodicity,
        fft_size / 2 + 1, coarse_frequency_axis, number_of_aperiodicities,
        coded_aperiodicity[i]);
  }

  delete[] coarse_frequency_axis;
  delete[] log_aperiodicity;
}